

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswread.c
# Opt level: O0

void ssw_openerror(ssw_fileinternal_t *f,char *msg)

{
  void *in_RDI;
  
  if (in_RDI != (void *)0x0) {
    if (*(long *)((long)in_RDI + 0xf8) != 0) {
      mcpl_generic_fclose((long)in_RDI + 0xf8);
    }
    *(undefined8 *)((long)in_RDI + 0xf8) = 0;
    free(*(void **)((long)in_RDI + 0x180));
    free(in_RDI);
  }
  ssw_error((char *)0x1029ab);
  return;
}

Assistant:

void ssw_openerror(ssw_fileinternal_t * f, const char* msg) {
  if (f) {
    if ( f->filehandle.internal )
      mcpl_generic_fclose( &f->filehandle );
    f->filehandle.internal = NULL;
    free(f->buf);
    free(f);
  }
  ssw_error(msg);
}